

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequential_attribute_decoders_controller.cc
# Opt level: O2

bool __thiscall
draco::SequentialAttributeDecodersController::DecodeAttributes
          (SequentialAttributeDecodersController *this,DecoderBuffer *buffer)

{
  PointsSequencer *pPVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  undefined4 extraout_var;
  ulong uVar6;
  ulong uVar7;
  
  pPVar1 = (this->sequencer_)._M_t.
           super___uniq_ptr_impl<draco::PointsSequencer,_std::default_delete<draco::PointsSequencer>_>
           ._M_t.
           super__Tuple_impl<0UL,_draco::PointsSequencer_*,_std::default_delete<draco::PointsSequencer>_>
           .super__Head_base<0UL,_draco::PointsSequencer_*,_false>._M_head_impl;
  if (pPVar1 != (PointsSequencer *)0x0) {
    pPVar1->out_point_ids_ = &this->point_ids_;
    iVar4 = (*pPVar1->_vptr_PointsSequencer[3])();
    if ((char)iVar4 != '\0') {
      uVar5 = (*(this->super_AttributesDecoder).super_AttributesDecoderInterface.
                _vptr_AttributesDecoderInterface[6])(this);
      uVar7 = 0;
      uVar6 = (ulong)uVar5;
      if ((int)uVar5 < 1) {
        uVar6 = uVar7;
      }
      do {
        if ((int)uVar6 == (int)uVar7) {
          bVar3 = AttributesDecoder::DecodeAttributes(&this->super_AttributesDecoder,buffer);
          return bVar3;
        }
        iVar4 = (*(this->super_AttributesDecoder).super_AttributesDecoderInterface.
                  _vptr_AttributesDecoderInterface[7])(this);
        lVar2 = *(long *)(CONCAT44(extraout_var,iVar4) + 8);
        iVar4 = (*(this->super_AttributesDecoder).super_AttributesDecoderInterface.
                  _vptr_AttributesDecoderInterface[5])(this,uVar7);
        pPVar1 = (this->sequencer_)._M_t.
                 super___uniq_ptr_impl<draco::PointsSequencer,_std::default_delete<draco::PointsSequencer>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_draco::PointsSequencer_*,_std::default_delete<draco::PointsSequencer>_>
                 .super__Head_base<0UL,_draco::PointsSequencer_*,_false>._M_head_impl;
        iVar4 = (*pPVar1->_vptr_PointsSequencer[2])
                          (pPVar1,*(undefined8 *)(*(long *)(lVar2 + 0x10) + (long)iVar4 * 8));
        uVar7 = (ulong)((int)uVar7 + 1);
      } while ((char)iVar4 != '\0');
    }
  }
  return false;
}

Assistant:

bool SequentialAttributeDecodersController::DecodeAttributes(
    DecoderBuffer *buffer) {
  if (!sequencer_ || !sequencer_->GenerateSequence(&point_ids_)) {
    return false;
  }
  // Initialize point to attribute value mapping for all decoded attributes.
  const int32_t num_attributes = GetNumAttributes();
  for (int i = 0; i < num_attributes; ++i) {
    PointAttribute *const pa =
        GetDecoder()->point_cloud()->attribute(GetAttributeId(i));
    if (!sequencer_->UpdatePointToAttributeIndexMapping(pa)) {
      return false;
    }
  }
  return AttributesDecoder::DecodeAttributes(buffer);
}